

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4c.cpp
# Opt level: O1

void anon_unknown.dwarf_7f6f::GetCentroid
               (double *x,int x_length,int fs,double current_f0,int fft_size,double current_position
               ,ForwardRealFFT *forward_real_fft,double *centroid,RandnState *randn_state)

{
  ulong uVar1;
  fft_plan p;
  fft_plan p_00;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  fft_plan *pfVar8;
  undefined8 *puVar9;
  long lVar10;
  byte bVar11;
  double x_00;
  double dVar12;
  double dVar13;
  undefined8 auStackY_a8 [5];
  undefined1 in_stack_ffffffffffffff80 [40];
  double __x;
  fft_plan *pfVar14;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar15;
  
  bVar11 = 0;
  uVar6 = (ulong)(uint)fft_size;
  if (0 < fft_size) {
    memset(forward_real_fft->waveform,0,uVar6 * 8);
  }
  GetWindowedWaveform(x,x_length,fs,current_f0,current_position,2,4.0,forward_real_fft->waveform,
                      randn_state);
  x_00 = ((double)fs + (double)fs) / current_f0;
  iVar2 = matlab_round(x_00);
  if (iVar2 < 0) {
    __x = 0.0;
  }
  else {
    __x = 0.0;
    lVar10 = -1;
    do {
      __x = __x + forward_real_fft->waveform[lVar10 + 1] * forward_real_fft->waveform[lVar10 + 1];
      iVar2 = matlab_round(x_00);
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar2 * 2);
  }
  iVar2 = matlab_round(x_00);
  if (-1 < iVar2) {
    lVar10 = -1;
    dVar13 = SQRT(__x);
    do {
      dVar12 = dVar13;
      if (__x < 0.0) {
        dVar12 = sqrt(__x);
      }
      forward_real_fft->waveform[lVar10 + 1] = forward_real_fft->waveform[lVar10 + 1] / dVar12;
      iVar2 = matlab_round(x_00);
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar2 * 2);
  }
  pfVar14 = &forward_real_fft->forward_fft;
  pfVar8 = pfVar14;
  puVar9 = auStackY_a8;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar9 = *(undefined8 *)pfVar8;
    pfVar8 = (fft_plan *)((long)pfVar8 + (ulong)bVar11 * -0x10 + 8);
    puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
  }
  p.out = (double *)pfVar14;
  p.n = in_stack_ffffffffffffff80._0_4_;
  p.sign = in_stack_ffffffffffffff80._4_4_;
  p.flags = in_stack_ffffffffffffff80._8_4_;
  p._12_4_ = in_stack_ffffffffffffff80._12_4_;
  p.c_in = (fft_complex *)in_stack_ffffffffffffff80._16_8_;
  p.in = (double *)in_stack_ffffffffffffff80._24_8_;
  p.c_out = (fft_complex *)in_stack_ffffffffffffff80._32_8_;
  p.input._0_4_ = in_stack_ffffffffffffffb0;
  p.input._4_4_ = fft_size;
  p.ip = (int *)x_00;
  p.w = centroid;
  fft_execute(p);
  iVar2 = fft_size / 2;
  uVar7 = 0xffffffffffffffff;
  if (-4 < fft_size) {
    uVar7 = (long)iVar2 * 8 + 8;
  }
  iVar15 = fft_size;
  pvVar3 = operator_new__(uVar7);
  pvVar4 = operator_new__(uVar7);
  if (-2 < fft_size) {
    pdVar5 = *forward_real_fft->spectrum + 1;
    uVar7 = 0;
    do {
      *(double *)((long)pvVar3 + uVar7 * 8) = (*(fft_complex *)(pdVar5 + -1))[0];
      *(double *)((long)pvVar4 + uVar7 * 8) = *pdVar5;
      uVar7 = uVar7 + 1;
      pdVar5 = pdVar5 + 2;
    } while (iVar2 + 1 != uVar7);
  }
  if (0 < iVar15) {
    pdVar5 = forward_real_fft->waveform;
    uVar7 = 0;
    do {
      uVar1 = uVar7 + 1;
      pdVar5[uVar7] = (double)(uVar1 & 0xffffffff) * pdVar5[uVar7];
      uVar7 = uVar1;
    } while (uVar6 != uVar1);
  }
  pfVar8 = pfVar14;
  puVar9 = auStackY_a8;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar9 = *(undefined8 *)pfVar8;
    pfVar8 = (fft_plan *)((long)pfVar8 + (ulong)bVar11 * -0x10 + 8);
    puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
  }
  p_00.out = (double *)pfVar14;
  p_00.n = in_stack_ffffffffffffff80._0_4_;
  p_00.sign = in_stack_ffffffffffffff80._4_4_;
  p_00.flags = in_stack_ffffffffffffff80._8_4_;
  p_00._12_4_ = in_stack_ffffffffffffff80._12_4_;
  p_00.c_in = (fft_complex *)in_stack_ffffffffffffff80._16_8_;
  p_00.in = (double *)in_stack_ffffffffffffff80._24_8_;
  p_00.c_out = (fft_complex *)in_stack_ffffffffffffff80._32_8_;
  p_00.input._0_4_ = in_stack_ffffffffffffffb0;
  p_00.input._4_4_ = iVar15;
  p_00.ip = (int *)x_00;
  p_00.w = centroid;
  fft_execute(p_00);
  if (-2 < iVar15) {
    pdVar5 = *forward_real_fft->spectrum + 1;
    uVar6 = 0;
    do {
      centroid[uVar6] =
           (*(fft_complex *)(pdVar5 + -1))[0] * *(double *)((long)pvVar3 + uVar6 * 8) +
           *(double *)((long)pvVar4 + uVar6 * 8) * *pdVar5;
      uVar6 = uVar6 + 1;
      pdVar5 = pdVar5 + 2;
    } while (iVar2 + 1 != uVar6);
  }
  operator_delete__(pvVar3);
  operator_delete__(pvVar4);
  return;
}

Assistant:

static void GetCentroid(const double *x, int x_length, int fs,
    double current_f0, int fft_size, double current_position,
    const ForwardRealFFT *forward_real_fft, double *centroid,
    RandnState *randn_state) {
  for (int i = 0; i < fft_size; ++i) forward_real_fft->waveform[i] = 0.0;
  GetWindowedWaveform(x, x_length, fs, current_f0,
      current_position, world::kBlackman, 4.0, forward_real_fft->waveform, randn_state);
  double power = 0.0;
  for (int i = 0; i <= matlab_round(2.0 * fs / current_f0) * 2; ++i)
    power += forward_real_fft->waveform[i] * forward_real_fft->waveform[i];
  for (int i = 0; i <= matlab_round(2.0 * fs / current_f0) * 2; ++i)
    forward_real_fft->waveform[i] /= sqrt(power);

  fft_execute(forward_real_fft->forward_fft);
  double *tmp_real = new double[fft_size / 2 + 1];
  double *tmp_imag = new double[fft_size / 2 + 1];
  for (int i = 0; i <= fft_size / 2; ++i) {
    tmp_real[i] = forward_real_fft->spectrum[i][0];
    tmp_imag[i] = forward_real_fft->spectrum[i][1];
  }

  for (int i = 0; i < fft_size; ++i)
    forward_real_fft->waveform[i] *= i + 1.0;
  fft_execute(forward_real_fft->forward_fft);
  for (int i = 0; i <= fft_size / 2; ++i)
    centroid[i] = forward_real_fft->spectrum[i][0] * tmp_real[i] +
      tmp_imag[i] * forward_real_fft->spectrum[i][1];

  delete[] tmp_real;
  delete[] tmp_imag;
}